

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::SharedLibraryShellCommand::executeExternalCommand
          (SharedLibraryShellCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  undefined1 auVar1 [24];
  pointer pSVar2;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this_00;
  long lVar3;
  ArrayRef<llvm::StringRef> commandLine;
  undefined6 uStack_106;
  undefined6 uStack_ee;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  TaskInterface ti_local;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_80;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  (anonymous_namespace)::SharedLibraryShellCommand::getArgs_abi_cxx11_(&args,this);
  local_e8._M_impl.super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_e8,
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pSVar2 = local_e8._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)local_e8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_e8._M_impl.super__Vector_impl_data._M_start;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&local_80,&completionFn->Storage);
  local_b0._8_8_ = 0;
  this_00 = (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
            operator_new(0x28);
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(this_00,&local_80);
  local_98 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
             ::_M_manager;
  local_b0._M_unused._M_object = this_00;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_b0);
  attributes._26_6_ = uStack_ee;
  attributes.inheritEnvironment = true;
  attributes.controlEnabled = true;
  auVar1 = ZEXT824(CONCAT62(uStack_106,1));
  attributes.canSafelyInterrupt = (bool)auVar1[0];
  attributes.connectToConsole = (bool)auVar1[1];
  attributes._2_6_ = auVar1._2_6_;
  attributes.workingDir.Data = (char *)SUB168(auVar1._8_16_,0);
  attributes.workingDir.Length = SUB168(auVar1._8_16_,8);
  commandLine.Length = lVar3 >> 4;
  commandLine.Data = pSVar2;
  llbuild::core::TaskInterface::spawn
            (&ti_local,context,commandLine,
             (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
             (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)&local_58,
             (ProcessDelegate *)0x0);
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&local_58);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&local_80);
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&, TaskInterface ti, QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {

    auto args = getArgs();
    ti.spawn(
        context, std::vector<StringRef>(args.begin(), args.end()), {},
        {true}, {[completionFn](ProcessResult result) {
          if (completionFn.hasValue())
            completionFn.getValue()(result);
        }});
  }